

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O3

void __thiscall QSqlQueryModelPrivate::initColOffsets(QSqlQueryModelPrivate *this,int size)

{
  long aalloc;
  long asize;
  
  asize = (long)size;
  aalloc = (this->colOffsets).super_QVLABase<int>.super_QVLABaseBase.a;
  if (aalloc <= asize) {
    aalloc = asize;
  }
  QVLABase<int>::reallocate_impl
            (&(this->colOffsets).super_QVLABase<int>,0x38,
             &(this->colOffsets).super_QVLAStorage<4UL,_4UL,_56LL>,asize,aalloc);
  (this->colOffsets).super_QVLABase<int>.super_QVLABaseBase.s = asize;
  memset((this->colOffsets).super_QVLABase<int>.super_QVLABaseBase.ptr,0,asize << 2);
  return;
}

Assistant:

void QSqlQueryModelPrivate::initColOffsets(int size)
{
    colOffsets.resize(size);
    memset(colOffsets.data(), 0, colOffsets.size() * sizeof(int));
}